

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseVectorSum.h
# Opt level: O2

void __thiscall HighsSparseVectorSum::add(HighsSparseVectorSum *this,HighsInt index,double value)

{
  HighsCDouble *this_00;
  pointer pHVar1;
  long lVar2;
  double dVar3;
  HighsInt local_14;
  
  lVar2 = (long)index;
  pHVar1 = (this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar3 = pHVar1[lVar2].hi + pHVar1[lVar2].lo;
  this_00 = pHVar1 + lVar2;
  local_14 = index;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    HighsCDouble::operator+=(this_00,value);
  }
  else {
    this_00->hi = value;
    this_00->lo = 0.0;
    std::vector<int,_std::allocator<int>_>::push_back(&this->nonzeroinds,&local_14);
    lVar2 = (long)local_14;
  }
  pHVar1 = (this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar3 = pHVar1[lVar2].hi + pHVar1[lVar2].lo;
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    pHVar1[lVar2].hi = 2.2250738585072014e-308;
    pHVar1[lVar2].lo = 0.0;
  }
  return;
}

Assistant:

void add(HighsInt index, double value) {
    assert(index >= 0 && index < (HighsInt)values.size());
    if (values[index] != 0.0) {
      values[index] += value;
    } else {
      values[index] = value;
      nonzeroinds.push_back(index);
    }

    if (values[index] == 0.0)
      values[index] = std::numeric_limits<double>::min();
  }